

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# case.c
# Opt level: O0

int32 strcmp_nocase(char *str1,char *str2)

{
  char cVar1;
  char cVar2;
  char c2;
  char *pcStack_20;
  char c1;
  char *str2_local;
  char *str1_local;
  
  if (str1 == str2) {
    str1_local._4_4_ = 0;
  }
  else if ((str1 == (char *)0x0) || (pcStack_20 = str2, str2_local = str1, str2 == (char *)0x0)) {
    str1_local._4_4_ = 1;
    if (str1 == (char *)0x0) {
      str1_local._4_4_ = -1;
    }
  }
  else {
    do {
      cVar1 = *str2_local;
      if (('`' < cVar1) && (cVar1 < '{')) {
        cVar1 = cVar1 + -0x20;
      }
      cVar2 = *pcStack_20;
      if (('`' < cVar2) && (cVar2 < '{')) {
        cVar2 = cVar2 + -0x20;
      }
      if (cVar1 != cVar2) {
        return (int)cVar1 - (int)cVar2;
      }
      pcStack_20 = pcStack_20 + 1;
      str2_local = str2_local + 1;
    } while (cVar1 != '\0');
    str1_local._4_4_ = 0;
  }
  return str1_local._4_4_;
}

Assistant:

int32
strcmp_nocase(const char *str1, const char *str2)
{
    char c1, c2;

    if (str1 == str2)
        return 0;
    if (str1 && str2) {
        for (;;) {
            c1 = *(str1++);
            c1 = UPPER_CASE(c1);
            c2 = *(str2++);
            c2 = UPPER_CASE(c2);
            if (c1 != c2)
                return (c1 - c2);
            if (c1 == '\0')
                return 0;
        }
    }
    else
        return (str1 == NULL) ? -1 : 1;

    return 0;
}